

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

void Prs_ManSkipSpaces(Prs_Man_t *p)

{
  int iVar1;
  Prs_Man_t *p_local;
  
  while( true ) {
    while (iVar1 = Prs_ManIsSpace(p), iVar1 != 0) {
      Prs_ManSkip(p);
    }
    iVar1 = Prs_ManIsChar(p,'\\');
    if (iVar1 == 0) break;
    Prs_ManSkipToChar(p,'\n');
    Prs_ManSkip(p);
  }
  iVar1 = Prs_ManIsChar(p,'#');
  if (iVar1 != 0) {
    Prs_ManSkipToChar(p,'\n');
  }
  iVar1 = Prs_ManIsSpace(p);
  if (iVar1 != 0) {
    __assert_fail("!Prs_ManIsSpace(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                  ,0x84,"void Prs_ManSkipSpaces(Prs_Man_t *)");
  }
  return;
}

Assistant:

static inline void Prs_ManSkipSpaces( Prs_Man_t * p )
{
    while ( 1 )
    {
        while ( Prs_ManIsSpace(p) )
            Prs_ManSkip(p);
        if ( Prs_ManIsChar(p, '\\') )
        {
            Prs_ManSkipToChar( p, '\n' );
            Prs_ManSkip(p);
            continue;
        }
        if ( Prs_ManIsChar(p, '#') )  
            Prs_ManSkipToChar( p, '\n' );
        break;
    }
    assert( !Prs_ManIsSpace(p) );
}